

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O3

bool __thiscall
JITTimeWorkItem::TryGetValueType(JITTimeWorkItem *this,uint symId,ValueType *valueType)

{
  code *pcVar1;
  bool bVar2;
  TSize TVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  undefined8 uStack_38;
  ValueType type;
  
  uStack_38 = in_RAX;
  if (this->m_workItemData->type != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                       ,0xb3,"(IsLoopBody())","IsLoopBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  RVar4 = JITTimeFunctionBody::GetConstCount(&this->m_jitBody);
  RVar5 = JITTimeFunctionBody::GetConstCount(&this->m_jitBody);
  if (RVar5 <= symId) {
    if (symId - RVar4 < this->m_workItemData->symIdToValueTypeMapCount) {
      uStack_38._6_2_ =
           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
            (this->m_workItemData->symIdToValueTypeMap + (symId - RVar4));
      TVar3 = ValueType::GetRawData((ValueType *)((long)&uStack_38 + 6));
      if (TVar3 != 0) {
        valueType->field_0 = uStack_38._6_2_;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
JITTimeWorkItem::TryGetValueType(uint symId, ValueType * valueType) const
{
    Assert(IsLoopBody());
    uint index = symId - m_jitBody.GetConstCount();
    if (symId >= m_jitBody.GetConstCount() && index < m_workItemData->symIdToValueTypeMapCount)
    {
        ValueType type = ((ValueType*)m_workItemData->symIdToValueTypeMap)[index];
        if (type.GetRawData() != 0)
        {
            *valueType = type;
            return true;
        }
    }
    return false;
}